

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode Curl_ws_accept(Curl_easy *data,char *mem,size_t nread)

{
  ssize_t sVar1;
  ssize_t nwritten;
  size_t chunk_size;
  Curl_cwriter *pCStack_40;
  CURLcode result;
  Curl_cwriter *ws_dec_writer;
  websocket *ws;
  SingleRequest *k;
  size_t nread_local;
  char *mem_local;
  Curl_easy *data_local;
  
  ws = (websocket *)&data->req;
  ws_dec_writer = (Curl_cwriter *)(data->conn->proto).ws;
  k = (SingleRequest *)nread;
  nread_local = (size_t)mem;
  mem_local = (char *)data;
  if ((websocket *)ws_dec_writer == (websocket *)0x0) {
    ws_dec_writer = (Curl_cwriter *)(*Curl_ccalloc)(1,0xf8);
    if (ws_dec_writer == (Curl_cwriter *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(Curl_cwriter **)(*(long *)(mem_local + 0x18) + 0x440) = ws_dec_writer;
    if ((((mem_local != (char *)0x0) && ((*(ulong *)(mem_local + 0xa9a) >> 0x1c & 1) != 0)) &&
        ((*(long *)(mem_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(mem_local + 0x1328) + 8)))))
       && (0 < Curl_trc_feat_ws.log_level)) {
      Curl_trc_ws((Curl_easy *)mem_local,"WS, using chunk size %zu",0xffff);
    }
    Curl_bufq_init2((bufq *)&ws_dec_writer[2].phase,0xffff,2,1);
    Curl_bufq_init2((bufq *)&ws_dec_writer[4].phase,0xffff,2,1);
    ws_dec_init((ws_decoder *)&ws_dec_writer->next);
    ws_enc_init((ws_encoder *)&ws_dec_writer[1].phase);
  }
  else {
    Curl_bufq_reset(&((websocket *)ws_dec_writer)->recvbuf);
    ws_dec_reset((ws_decoder *)&ws_dec_writer->next);
    ws_enc_reset((ws_encoder *)&ws_dec_writer[1].phase);
  }
  chunk_size._4_4_ =
       Curl_rand_bytes((Curl_easy *)mem_local,(uchar *)((long)&ws_dec_writer[2].next + 4),4);
  data_local._4_4_ = chunk_size._4_4_;
  if (chunk_size._4_4_ == CURLE_OK) {
    if (((mem_local != (char *)0x0) && ((*(ulong *)(mem_local + 0xa9a) >> 0x1c & 1) != 0)) &&
       ((*(long *)(mem_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(mem_local + 0x1328) + 8)))))
    {
      Curl_infof((Curl_easy *)mem_local,"Received 101, switch to WebSocket; mask %02x%02x%02x%02x",
                 (ulong)*(byte *)((long)&ws_dec_writer[2].next + 4),
                 (ulong)*(byte *)((long)&ws_dec_writer[2].next + 5),
                 (ulong)*(byte *)((long)&ws_dec_writer[2].next + 6),
                 (ulong)*(byte *)((long)&ws_dec_writer[2].next + 7));
    }
    chunk_size._4_4_ =
         Curl_cwriter_create(&stack0xffffffffffffffc0,(Curl_easy *)mem_local,&ws_cw_decode,
                             CURL_CW_CONTENT_DECODE);
    data_local._4_4_ = chunk_size._4_4_;
    if (chunk_size._4_4_ == CURLE_OK) {
      chunk_size._4_4_ = Curl_cwriter_add((Curl_easy *)mem_local,pCStack_40);
      if (chunk_size._4_4_ == CURLE_OK) {
        if (mem_local[0xa99] == '\0') {
          if (k != (SingleRequest *)0x0) {
            chunk_size._4_4_ =
                 Curl_client_write((Curl_easy *)mem_local,1,(char *)nread_local,(size_t)k);
          }
        }
        else {
          sVar1 = Curl_bufq_write((bufq *)&ws_dec_writer[2].phase,(uchar *)nread_local,(size_t)k,
                                  (CURLcode *)((long)&chunk_size + 4));
          if (sVar1 < 0) {
            return chunk_size._4_4_;
          }
          if (((mem_local != (char *)0x0) && ((*(ulong *)(mem_local + 0xa9a) >> 0x1c & 1) != 0)) &&
             ((*(long *)(mem_local + 0x1328) == 0 ||
              (0 < *(int *)(*(long *)(mem_local + 0x1328) + 8))))) {
            Curl_infof((Curl_easy *)mem_local,"%zu bytes websocket payload",k);
          }
        }
        *(undefined4 *)&(ws->enc).field_0x1c = 3;
        data_local._4_4_ = chunk_size._4_4_;
      }
      else {
        Curl_cwriter_free((Curl_easy *)mem_local,pCStack_40);
        data_local._4_4_ = chunk_size._4_4_;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ws_accept(struct Curl_easy *data,
                        const char *mem, size_t nread)
{
  struct SingleRequest *k = &data->req;
  struct websocket *ws;
  struct Curl_cwriter *ws_dec_writer;
  CURLcode result;

  DEBUGASSERT(data->conn);
  ws = data->conn->proto.ws;
  if(!ws) {
    size_t chunk_size = WS_CHUNK_SIZE;
    ws = calloc(1, sizeof(*ws));
    if(!ws)
      return CURLE_OUT_OF_MEMORY;
    data->conn->proto.ws = ws;
#ifdef DEBUGBUILD
    {
      char *p = getenv("CURL_WS_CHUNK_SIZE");
      if(p) {
        long l = strtol(p, NULL, 10);
        if(l > 0 && l <= (1*1024*1024)) {
          chunk_size = (size_t)l;
        }
      }
    }
#endif
    CURL_TRC_WS(data, "WS, using chunk size %zu", chunk_size);
    Curl_bufq_init2(&ws->recvbuf, chunk_size, WS_CHUNK_COUNT,
                    BUFQ_OPT_SOFT_LIMIT);
    Curl_bufq_init2(&ws->sendbuf, chunk_size, WS_CHUNK_COUNT,
                    BUFQ_OPT_SOFT_LIMIT);
    ws_dec_init(&ws->dec);
    ws_enc_init(&ws->enc);
  }
  else {
    Curl_bufq_reset(&ws->recvbuf);
    ws_dec_reset(&ws->dec);
    ws_enc_reset(&ws->enc);
  }
  /* Verify the Sec-WebSocket-Accept response.

     The sent value is the base64 encoded version of a SHA-1 hash done on the
     |Sec-WebSocket-Key| header field concatenated with
     the string "258EAFA5-E914-47DA-95CA-C5AB0DC85B11".
  */

  /* If the response includes a |Sec-WebSocket-Extensions| header field and
     this header field indicates the use of an extension that was not present
     in the client's handshake (the server has indicated an extension not
     requested by the client), the client MUST Fail the WebSocket Connection.
  */

  /* If the response includes a |Sec-WebSocket-Protocol| header field
     and this header field indicates the use of a subprotocol that was
     not present in the client's handshake (the server has indicated a
     subprotocol not requested by the client), the client MUST Fail
     the WebSocket Connection. */

  /* 4 bytes random */

  result = Curl_rand(data, (unsigned char *)&ws->enc.mask,
                     sizeof(ws->enc.mask));
  if(result)
    return result;
  infof(data, "Received 101, switch to WebSocket; mask %02x%02x%02x%02x",
        ws->enc.mask[0], ws->enc.mask[1], ws->enc.mask[2], ws->enc.mask[3]);

  /* Install our client writer that decodes WS frames payload */
  result = Curl_cwriter_create(&ws_dec_writer, data, &ws_cw_decode,
                               CURL_CW_CONTENT_DECODE);
  if(result)
    return result;

  result = Curl_cwriter_add(data, ws_dec_writer);
  if(result) {
    Curl_cwriter_free(data, ws_dec_writer);
    return result;
  }

  if(data->set.connect_only) {
    ssize_t nwritten;
    /* In CONNECT_ONLY setup, the payloads from `mem` need to be received
     * when using `curl_ws_recv` later on after this transfer is already
     * marked as DONE. */
    nwritten = Curl_bufq_write(&ws->recvbuf, (const unsigned char *)mem,
                               nread, &result);
    if(nwritten < 0)
      return result;
    infof(data, "%zu bytes websocket payload", nread);
  }
  else { /* !connect_only */
    /* And pass any additional data to the writers */
    if(nread) {
      result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)mem, nread);
    }
  }
  k->upgr101 = UPGR101_RECEIVED;

  return result;
}